

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

int __thiscall cmCPackIFWGenerator::PackageFiles(cmCPackIFWGenerator *this)

{
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_00;
  pointer pcVar2;
  long *msg;
  int iVar3;
  size_t length;
  string *psVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string ifwTLD;
  string ifwTmpFile;
  ostringstream cmCPackLog_msg;
  long *local_1d0;
  pointer local_1c8;
  long local_1c0 [2];
  string local_1b0;
  string local_190;
  char *local_170;
  undefined8 local_168;
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"- Configuration",0xf);
  std::ios::widen((char)&local_190 + (char)*(undefined8 *)(local_190._M_dataplus._M_p + -0x18));
  std::ostream::put((char)&local_190);
  std::ostream::flush();
  pcVar1 = (this->super_cmCPackIFWCommon).Generator;
  if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
    this_00 = (pcVar1->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    msg = local_1d0;
    length = strlen((char *)local_1d0);
    cmCPackLog::Log(this_00,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x1f,(char *)msg,length);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  cmCPackIFWInstaller::GenerateInstallerFile(&this->Installer);
  cmCPackIFWInstaller::GeneratePackageFiles(&this->Installer);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"CPACK_TOPLEVEL_DIRECTORY","");
  psVar4 = (string *)cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_190);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar2,pcVar2 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = local_1c8;
  local_190._M_string_length = (size_type)local_1d0;
  local_190.field_2._M_allocated_capacity = 0;
  local_190.field_2._8_8_ = 0xe;
  local_170 = "/IFWOutput.log";
  local_168 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_190;
  cmCatViews(&local_1b0,views);
  iVar3 = RunRepogen(this,&local_1b0);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = RunBinaryCreator(this,&local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  return iVar3;
}

Assistant:

int cmCPackIFWGenerator::PackageFiles()
{
  cmCPackIFWLogger(OUTPUT, "- Configuration" << std::endl);

  // Installer configuragion
  this->Installer.GenerateInstallerFile();

  // Packages configuration
  this->Installer.GeneratePackageFiles();

  std::string ifwTLD = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string ifwTmpFile = cmStrCat(ifwTLD, "/IFWOutput.log");

  // Create repositories
  if (!this->RunRepogen(ifwTmpFile)) {
    return 0;
  }

  // Create installer
  if (!this->RunBinaryCreator(ifwTmpFile)) {
    return 0;
  }

  return 1;
}